

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::set_assumptions(Engine *this,vec<BoolView> *xs)

{
  uint uVar1;
  Lit p;
  vec<BoolView> *in_RSI;
  vec<int> *in_RDI;
  uint li;
  BoolView *in_stack_ffffffffffffffb8;
  vec<int> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  uint local_14;
  
  vec<int>::clear(in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  local_14 = 0;
  while( true ) {
    uVar2 = local_14;
    uVar1 = vec<BoolView>::size(in_RSI);
    if (uVar1 <= uVar2) break;
    vec<BoolView>::operator[](in_RSI,local_14);
    p = BoolView::getLit(in_stack_ffffffffffffffb8,false);
    toInt(p);
    vec<int>::push(in_RDI,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    local_14 = local_14 + 1;
  }
  if (in_RDI[7].data != (int *)0x0) {
    toInt(::lit_True);
    vec<int>::push(in_RDI,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

void Engine::set_assumptions(vec<BoolView>& xs) {
	// Push the assumptions, then search as usual.
	assumptions.clear();
	for (unsigned int li = 0; li < xs.size(); li++) {
		assumptions.push(toInt(xs[li].getLit(true)));
	}
	// constrain will overwrite the last assumption;
	// make sure there is a placeholder to overwrite.
	if (opt_var != nullptr) {
		assumptions.push(toInt(lit_True));
	}
}